

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O3

iterator * __thiscall
skiplist<DictKey,_std::less<DictKey>_>::find
          (iterator *__return_storage_ptr__,skiplist<DictKey,_std::less<DictKey>_> *this,
          DictKey *value)

{
  pointer ppSVar1;
  int iVar2;
  SLNode<DictKey> *pSVar3;
  SLNode<DictKey> *pSVar4;
  
  ppSVar1 = (this->key).super__Vector_base<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((this->key).super__Vector_base<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>._M_impl.
      super__Vector_impl_data._M_start != ppSVar1) {
    pSVar3 = ppSVar1[-1];
    while (pSVar3->down != (SLNode<DictKey> *)0x0) {
      do {
        pSVar4 = pSVar3;
        pSVar3 = pSVar4->next;
        if (pSVar3 == (SLNode<DictKey> *)0x0) break;
      } while ((pSVar3->val).key_ < value->key_);
      pSVar3 = pSVar4->down;
    }
    do {
      pSVar3 = pSVar3->next;
      if (pSVar3 == (SLNode<DictKey> *)0x0) goto LAB_001030f2;
      iVar2 = (pSVar3->val).key_;
    } while (iVar2 < value->key_);
    if (iVar2 == value->key_) {
      __return_storage_ptr__->node = pSVar3;
      iVar2 = pSVar3->count + -1;
      __return_storage_ptr__->node_count_ = iVar2;
      __return_storage_ptr__->node_count_ref_ = iVar2;
      goto LAB_001030fb;
    }
  }
LAB_001030f2:
  __return_storage_ptr__->node = (SLNode<DictKey> *)0x0;
  __return_storage_ptr__->node_count_ = 0;
  __return_storage_ptr__->node_count_ref_ = 0;
LAB_001030fb:
  __return_storage_ptr__->reverse_ = false;
  return __return_storage_ptr__;
}

Assistant:

typename skiplist<T, X>::iterator skiplist<T, X>::find(T value) {
    // Same algorithm as erase, but without erasing anything ;)
    if(key.empty())
        return end();

    // Start from top left
    SLNode<T>* follow = key.back();
    // Go on till level 0
    while(follow->down) {
        while(follow->next && compare(follow->next->val, value))
            follow = follow->next;
        follow = follow->down;
    }
    // Traverse at level 0 till dest reached
    while(follow->next && compare(follow->next->val, value))
        follow = follow->next;

    // If not exist, leave
    if(!follow->next || !_420_is_equal(follow->next->val, value, compare))
        return end();

    // This is the node for sure
    follow = follow->next;
    return iterator(follow);
}